

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  uint uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  RTCIntersectArguments *pRVar74;
  Scene *pSVar75;
  ulong *puVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar91;
  undefined1 auVar85 [32];
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar86 [32];
  float fVar95;
  float fVar102;
  float fVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  float fVar104;
  float fVar107;
  float fVar109;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar105;
  float fVar106;
  float fVar108;
  undefined1 auVar101 [64];
  float fVar110;
  float fVar115;
  float fVar116;
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar117;
  undefined1 auVar113 [32];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [64];
  float fVar121;
  float fVar122;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar127 [64];
  float fVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [64];
  float fVar150;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar168 [64];
  float fVar181;
  float fVar182;
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar184 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar202 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_180c;
  Scene *local_1808;
  undefined8 local_1800;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  long local_17d0;
  long local_17c8;
  undefined8 local_17c0;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined4 local_17a0;
  float local_179c;
  float local_1798;
  undefined4 local_1794;
  undefined4 local_1790;
  undefined4 local_178c;
  uint local_1788;
  uint local_1784;
  uint local_1780;
  RTCFilterFunctionNArguments local_1770;
  undefined1 local_1740 [32];
  undefined8 local_1720;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      puVar76 = local_1200 + 1;
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar80._8_4_ = 0x7fffffff;
      auVar80._0_8_ = 0x7fffffff7fffffff;
      auVar80._12_4_ = 0x7fffffff;
      auVar80 = vandps_avx((undefined1  [16])aVar3,auVar80);
      auVar123._8_4_ = 0x219392ef;
      auVar123._0_8_ = 0x219392ef219392ef;
      auVar123._12_4_ = 0x219392ef;
      auVar80 = vcmpps_avx(auVar80,auVar123,1);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar123 = vdivps_avx(auVar124,(undefined1  [16])aVar3);
      auVar125._8_4_ = 0x5d5e0b6b;
      auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar125._12_4_ = 0x5d5e0b6b;
      auVar80 = vblendvps_avx(auVar123,auVar125,auVar80);
      auVar111._0_4_ = auVar80._0_4_ * 0.99999964;
      auVar111._4_4_ = auVar80._4_4_ * 0.99999964;
      auVar111._8_4_ = auVar80._8_4_ * 0.99999964;
      auVar111._12_4_ = auVar80._12_4_ * 0.99999964;
      auVar96._0_4_ = auVar80._0_4_ * 1.0000004;
      auVar96._4_4_ = auVar80._4_4_ * 1.0000004;
      auVar96._8_4_ = auVar80._8_4_ * 1.0000004;
      auVar96._12_4_ = auVar80._12_4_ * 1.0000004;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_1520._4_4_ = uVar2;
      local_1520._0_4_ = uVar2;
      local_1520._8_4_ = uVar2;
      local_1520._12_4_ = uVar2;
      local_1520._16_4_ = uVar2;
      local_1520._20_4_ = uVar2;
      local_1520._24_4_ = uVar2;
      local_1520._28_4_ = uVar2;
      auVar153 = ZEXT3264(local_1520);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1540._4_4_ = uVar2;
      local_1540._0_4_ = uVar2;
      local_1540._8_4_ = uVar2;
      local_1540._12_4_ = uVar2;
      local_1540._16_4_ = uVar2;
      local_1540._20_4_ = uVar2;
      local_1540._24_4_ = uVar2;
      local_1540._28_4_ = uVar2;
      auVar161 = ZEXT3264(local_1540);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1560._4_4_ = uVar2;
      local_1560._0_4_ = uVar2;
      local_1560._8_4_ = uVar2;
      local_1560._12_4_ = uVar2;
      local_1560._16_4_ = uVar2;
      local_1560._20_4_ = uVar2;
      local_1560._24_4_ = uVar2;
      local_1560._28_4_ = uVar2;
      auVar163 = ZEXT3264(local_1560);
      auVar80 = vshufps_avx(auVar111,auVar111,0);
      local_1580._16_16_ = auVar80;
      local_1580._0_16_ = auVar80;
      auVar165 = ZEXT3264(local_1580);
      auVar80 = vmovshdup_avx(auVar111);
      auVar123 = vshufps_avx(auVar111,auVar111,0x55);
      local_15a0._16_16_ = auVar123;
      local_15a0._0_16_ = auVar123;
      auVar168 = ZEXT3264(local_15a0);
      auVar123 = vshufpd_avx(auVar111,auVar111,1);
      auVar124 = vshufps_avx(auVar111,auVar111,0xaa);
      local_15c0._16_16_ = auVar124;
      local_15c0._0_16_ = auVar124;
      auVar184 = ZEXT3264(local_15c0);
      auVar124 = vshufps_avx(auVar96,auVar96,0);
      local_15e0._16_16_ = auVar124;
      local_15e0._0_16_ = auVar124;
      auVar198 = ZEXT3264(local_15e0);
      auVar124 = vshufps_avx(auVar96,auVar96,0x55);
      local_1600._16_16_ = auVar124;
      local_1600._0_16_ = auVar124;
      auVar114 = ZEXT3264(local_1600);
      auVar124 = vshufps_avx(auVar96,auVar96,0xaa);
      local_1620._16_16_ = auVar124;
      local_1620._0_16_ = auVar124;
      auVar101 = ZEXT3264(local_1620);
      uVar77 = (ulong)(auVar111._0_4_ < 0.0) << 5;
      uVar73 = (ulong)(auVar80._0_4_ < 0.0) << 5 | 0x40;
      uVar78 = (ulong)(auVar123._0_4_ < 0.0) << 5 | 0x80;
      uVar79 = uVar77 ^ 0x20;
      auVar80 = vshufps_avx(auVar19,auVar19,0);
      local_1640._16_16_ = auVar80;
      local_1640._0_16_ = auVar80;
      auVar127 = ZEXT3264(local_1640);
      auVar80 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      local_14e0._0_16_ = mm_lookupmask_ps._0_16_;
      local_14e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_1660._16_16_ = auVar80;
      local_1660._0_16_ = auVar80;
      auVar143 = ZEXT3264(local_1660);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar85._16_4_ = 0x3f800000;
      auVar85._20_4_ = 0x3f800000;
      auVar85._24_4_ = 0x3f800000;
      auVar85._28_4_ = 0x3f800000;
      auVar81._8_4_ = 0xbf800000;
      auVar81._0_8_ = 0xbf800000bf800000;
      auVar81._12_4_ = 0xbf800000;
      auVar81._16_4_ = 0xbf800000;
      auVar81._20_4_ = 0xbf800000;
      auVar81._24_4_ = 0xbf800000;
      auVar81._28_4_ = 0xbf800000;
      _local_1500 = vblendvps_avx(auVar85,auVar81,local_14e0);
LAB_00e6b85d:
      if (puVar76 != local_1200) {
        uVar72 = puVar76[-1];
        puVar76 = puVar76 + -1;
        while ((uVar72 & 8) == 0) {
          auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar77),auVar153._0_32_);
          auVar20._4_4_ = auVar165._4_4_ * auVar81._4_4_;
          auVar20._0_4_ = auVar165._0_4_ * auVar81._0_4_;
          auVar20._8_4_ = auVar165._8_4_ * auVar81._8_4_;
          auVar20._12_4_ = auVar165._12_4_ * auVar81._12_4_;
          auVar20._16_4_ = auVar165._16_4_ * auVar81._16_4_;
          auVar20._20_4_ = auVar165._20_4_ * auVar81._20_4_;
          auVar20._24_4_ = auVar165._24_4_ * auVar81._24_4_;
          auVar20._28_4_ = auVar81._28_4_;
          auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar73),auVar161._0_32_);
          auVar21._4_4_ = auVar168._4_4_ * auVar81._4_4_;
          auVar21._0_4_ = auVar168._0_4_ * auVar81._0_4_;
          auVar21._8_4_ = auVar168._8_4_ * auVar81._8_4_;
          auVar21._12_4_ = auVar168._12_4_ * auVar81._12_4_;
          auVar21._16_4_ = auVar168._16_4_ * auVar81._16_4_;
          auVar21._20_4_ = auVar168._20_4_ * auVar81._20_4_;
          auVar21._24_4_ = auVar168._24_4_ * auVar81._24_4_;
          auVar21._28_4_ = auVar81._28_4_;
          auVar81 = vmaxps_avx(auVar20,auVar21);
          auVar85 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar78),auVar163._0_32_);
          auVar22._4_4_ = auVar184._4_4_ * auVar85._4_4_;
          auVar22._0_4_ = auVar184._0_4_ * auVar85._0_4_;
          auVar22._8_4_ = auVar184._8_4_ * auVar85._8_4_;
          auVar22._12_4_ = auVar184._12_4_ * auVar85._12_4_;
          auVar22._16_4_ = auVar184._16_4_ * auVar85._16_4_;
          auVar22._20_4_ = auVar184._20_4_ * auVar85._20_4_;
          auVar22._24_4_ = auVar184._24_4_ * auVar85._24_4_;
          auVar22._28_4_ = auVar85._28_4_;
          auVar85 = vmaxps_avx(auVar22,auVar127._0_32_);
          auVar81 = vmaxps_avx(auVar81,auVar85);
          auVar85 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar79),auVar153._0_32_);
          auVar23._4_4_ = auVar198._4_4_ * auVar85._4_4_;
          auVar23._0_4_ = auVar198._0_4_ * auVar85._0_4_;
          auVar23._8_4_ = auVar198._8_4_ * auVar85._8_4_;
          auVar23._12_4_ = auVar198._12_4_ * auVar85._12_4_;
          auVar23._16_4_ = auVar198._16_4_ * auVar85._16_4_;
          auVar23._20_4_ = auVar198._20_4_ * auVar85._20_4_;
          auVar23._24_4_ = auVar198._24_4_ * auVar85._24_4_;
          auVar23._28_4_ = auVar85._28_4_;
          auVar85 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar73 ^ 0x20)),
                               auVar161._0_32_);
          auVar24._4_4_ = auVar114._4_4_ * auVar85._4_4_;
          auVar24._0_4_ = auVar114._0_4_ * auVar85._0_4_;
          auVar24._8_4_ = auVar114._8_4_ * auVar85._8_4_;
          auVar24._12_4_ = auVar114._12_4_ * auVar85._12_4_;
          auVar24._16_4_ = auVar114._16_4_ * auVar85._16_4_;
          auVar24._20_4_ = auVar114._20_4_ * auVar85._20_4_;
          auVar24._24_4_ = auVar114._24_4_ * auVar85._24_4_;
          auVar24._28_4_ = auVar85._28_4_;
          auVar85 = vminps_avx(auVar23,auVar24);
          auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar78 ^ 0x20)),
                               auVar163._0_32_);
          auVar25._4_4_ = auVar101._4_4_ * auVar20._4_4_;
          auVar25._0_4_ = auVar101._0_4_ * auVar20._0_4_;
          auVar25._8_4_ = auVar101._8_4_ * auVar20._8_4_;
          auVar25._12_4_ = auVar101._12_4_ * auVar20._12_4_;
          auVar25._16_4_ = auVar101._16_4_ * auVar20._16_4_;
          auVar25._20_4_ = auVar101._20_4_ * auVar20._20_4_;
          auVar25._24_4_ = auVar101._24_4_ * auVar20._24_4_;
          auVar25._28_4_ = auVar20._28_4_;
          auVar20 = vminps_avx(auVar25,auVar143._0_32_);
          auVar85 = vminps_avx(auVar85,auVar20);
          auVar81 = vcmpps_avx(auVar81,auVar85,2);
          uVar68 = vmovmskps_avx(auVar81);
          if (uVar68 == 0) goto LAB_00e6b85d;
          uVar68 = uVar68 & 0xff;
          uVar69 = uVar72 & 0xfffffffffffffff0;
          lVar10 = 0;
          if (uVar68 != 0) {
            for (; (uVar68 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar72 = *(ulong *)(uVar69 + lVar10 * 8);
          uVar68 = uVar68 - 1 & uVar68;
          uVar71 = (ulong)uVar68;
          if (uVar68 != 0) {
            do {
              *puVar76 = uVar72;
              puVar76 = puVar76 + 1;
              lVar10 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar72 = *(ulong *)(uVar69 + lVar10 * 8);
              uVar71 = uVar71 - 1 & uVar71;
            } while (uVar71 != 0);
          }
        }
        local_17c8 = (ulong)((uint)uVar72 & 0xf) - 8;
        uVar72 = uVar72 & 0xfffffffffffffff0;
        for (local_17d0 = 0; local_17d0 != local_17c8; local_17d0 = local_17d0 + 1) {
          lVar70 = local_17d0 * 0x60;
          pSVar75 = context->scene;
          local_1808 = pSVar75;
          ppfVar4 = (pSVar75->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar72 + 0x40 + lVar70)];
          pfVar6 = ppfVar4[*(uint *)(uVar72 + 0x44 + lVar70)];
          pfVar7 = ppfVar4[*(uint *)(uVar72 + 0x48 + lVar70)];
          pfVar8 = ppfVar4[*(uint *)(uVar72 + 0x4c + lVar70)];
          auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + lVar70)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 8 + lVar70)));
          auVar80 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + lVar70)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 8 + lVar70)));
          auVar124 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 4 + lVar70)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0xc + lVar70))
                                  );
          auVar123 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 4 + lVar70)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0xc + lVar70))
                                  );
          auVar111 = vunpcklps_avx(auVar80,auVar123);
          auVar125 = vunpcklps_avx(auVar19,auVar124);
          auVar80 = vunpckhps_avx(auVar19,auVar124);
          auVar124 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar72 + 0x10 + lVar70)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x18 + lVar70)));
          auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar72 + 0x10 + lVar70)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x18 + lVar70)));
          auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x14 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x1c + lVar70)));
          auVar19 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x14 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x1c + lVar70)));
          auVar28 = vunpcklps_avx(auVar123,auVar19);
          auVar29 = vunpcklps_avx(auVar124,auVar96);
          auVar123 = vunpckhps_avx(auVar124,auVar96);
          auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x20 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x28 + lVar70)));
          auVar19 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x20 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x28 + lVar70)));
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x24 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x2c + lVar70)));
          auVar124 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar72 + 0x24 + lVar70)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x2c + lVar70)));
          auVar31 = vunpcklps_avx(auVar19,auVar124);
          auVar32 = vunpcklps_avx(auVar96,auVar30);
          auVar19 = vunpckhps_avx(auVar96,auVar30);
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x30 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x38 + lVar70)));
          auVar124 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar72 + 0x30 + lVar70)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar72 + 0x38 + lVar70)));
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x34 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x3c + lVar70)));
          auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x34 + lVar70))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar72 + 0x3c + lVar70)));
          auVar96 = vunpcklps_avx(auVar124,auVar96);
          auVar34 = vunpcklps_avx(auVar30,auVar33);
          lVar10 = uVar72 + 0x40 + lVar70;
          local_13e0 = *(undefined8 *)(lVar10 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar10 + 0x18);
          auVar124 = vunpckhps_avx(auVar30,auVar33);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar70 = uVar72 + 0x50 + lVar70;
          local_1400 = *(undefined8 *)(lVar70 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar70 + 0x18);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar202._16_16_ = auVar32;
          auVar202._0_16_ = auVar125;
          auVar151._16_16_ = auVar19;
          auVar151._0_16_ = auVar80;
          auVar82._16_16_ = auVar31;
          auVar82._0_16_ = auVar111;
          auVar112._16_16_ = auVar29;
          auVar112._0_16_ = auVar29;
          auVar126._16_16_ = auVar123;
          auVar126._0_16_ = auVar123;
          auVar83._16_16_ = auVar28;
          auVar83._0_16_ = auVar28;
          auVar162._16_16_ = auVar34;
          auVar162._0_16_ = auVar34;
          auVar164._16_16_ = auVar124;
          auVar164._0_16_ = auVar124;
          auVar97._16_16_ = auVar96;
          auVar97._0_16_ = auVar96;
          uVar2 = *(undefined4 *)&(ray->org).field_0;
          auVar183._4_4_ = uVar2;
          auVar183._0_4_ = uVar2;
          auVar183._8_4_ = uVar2;
          auVar183._12_4_ = uVar2;
          auVar183._16_4_ = uVar2;
          auVar183._20_4_ = uVar2;
          auVar183._24_4_ = uVar2;
          auVar183._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar197._4_4_ = uVar2;
          auVar197._0_4_ = uVar2;
          auVar197._8_4_ = uVar2;
          auVar197._12_4_ = uVar2;
          auVar197._16_4_ = uVar2;
          auVar197._20_4_ = uVar2;
          auVar197._24_4_ = uVar2;
          auVar197._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar199._4_4_ = uVar2;
          auVar199._0_4_ = uVar2;
          auVar199._8_4_ = uVar2;
          auVar199._12_4_ = uVar2;
          auVar199._16_4_ = uVar2;
          auVar199._20_4_ = uVar2;
          auVar199._24_4_ = uVar2;
          auVar199._28_4_ = uVar2;
          local_1680 = vsubps_avx(auVar202,auVar183);
          local_16a0 = vsubps_avx(auVar151,auVar197);
          local_16c0 = vsubps_avx(auVar82,auVar199);
          auVar81 = vsubps_avx(auVar112,auVar183);
          auVar85 = vsubps_avx(auVar126,auVar197);
          auVar20 = vsubps_avx(auVar83,auVar199);
          auVar21 = vsubps_avx(auVar162,auVar183);
          auVar22 = vsubps_avx(auVar164,auVar197);
          auVar23 = vsubps_avx(auVar97,auVar199);
          local_16e0 = vsubps_avx(auVar21,local_1680);
          local_1700 = vsubps_avx(auVar22,local_16a0);
          local_1420 = vsubps_avx(auVar23,local_16c0);
          fVar200 = local_16a0._0_4_;
          fVar110 = fVar200 + auVar22._0_4_;
          fVar203 = local_16a0._4_4_;
          fVar115 = fVar203 + auVar22._4_4_;
          fVar205 = local_16a0._8_4_;
          fVar116 = fVar205 + auVar22._8_4_;
          fVar207 = local_16a0._12_4_;
          fVar117 = fVar207 + auVar22._12_4_;
          fVar209 = local_16a0._16_4_;
          fVar118 = fVar209 + auVar22._16_4_;
          fVar211 = local_16a0._20_4_;
          fVar119 = fVar211 + auVar22._20_4_;
          fVar213 = local_16a0._24_4_;
          fVar120 = fVar213 + auVar22._24_4_;
          fVar89 = local_16a0._28_4_;
          fVar1 = local_16c0._0_4_;
          fVar121 = auVar23._0_4_ + fVar1;
          fVar12 = local_16c0._4_4_;
          fVar128 = auVar23._4_4_ + fVar12;
          fVar14 = local_16c0._8_4_;
          fVar130 = auVar23._8_4_ + fVar14;
          fVar16 = local_16c0._12_4_;
          fVar132 = auVar23._12_4_ + fVar16;
          fVar88 = local_16c0._16_4_;
          fVar134 = auVar23._16_4_ + fVar88;
          fVar92 = local_16c0._20_4_;
          fVar136 = auVar23._20_4_ + fVar92;
          fVar17 = local_16c0._24_4_;
          fVar138 = auVar23._24_4_ + fVar17;
          fVar140 = local_1420._0_4_;
          fVar144 = local_1420._4_4_;
          auVar26._4_4_ = fVar144 * fVar115;
          auVar26._0_4_ = fVar140 * fVar110;
          fVar145 = local_1420._8_4_;
          auVar26._8_4_ = fVar145 * fVar116;
          fVar146 = local_1420._12_4_;
          auVar26._12_4_ = fVar146 * fVar117;
          fVar147 = local_1420._16_4_;
          auVar26._16_4_ = fVar147 * fVar118;
          fVar148 = local_1420._20_4_;
          auVar26._20_4_ = fVar148 * fVar119;
          fVar149 = local_1420._24_4_;
          auVar26._24_4_ = fVar149 * fVar120;
          auVar26._28_4_ = auVar19._12_4_;
          fVar181 = local_1700._0_4_;
          fVar185 = local_1700._4_4_;
          auVar27._4_4_ = fVar185 * fVar128;
          auVar27._0_4_ = fVar181 * fVar121;
          fVar187 = local_1700._8_4_;
          auVar27._8_4_ = fVar187 * fVar130;
          fVar189 = local_1700._12_4_;
          auVar27._12_4_ = fVar189 * fVar132;
          fVar191 = local_1700._16_4_;
          auVar27._16_4_ = fVar191 * fVar134;
          fVar193 = local_1700._20_4_;
          auVar27._20_4_ = fVar193 * fVar136;
          fVar195 = local_1700._24_4_;
          auVar27._24_4_ = fVar195 * fVar138;
          auVar27._28_4_ = auVar34._12_4_;
          auVar24 = vsubps_avx(auVar27,auVar26);
          fVar11 = local_1680._0_4_;
          fVar150 = auVar21._0_4_ + fVar11;
          fVar13 = local_1680._4_4_;
          fVar154 = auVar21._4_4_ + fVar13;
          fVar15 = local_1680._8_4_;
          fVar155 = auVar21._8_4_ + fVar15;
          fVar87 = local_1680._12_4_;
          fVar156 = auVar21._12_4_ + fVar87;
          fVar90 = local_1680._16_4_;
          fVar157 = auVar21._16_4_ + fVar90;
          fVar94 = local_1680._20_4_;
          fVar158 = auVar21._20_4_ + fVar94;
          fVar18 = local_1680._24_4_;
          fVar159 = auVar21._24_4_ + fVar18;
          fVar95 = local_16e0._0_4_;
          fVar102 = local_16e0._4_4_;
          auVar35._4_4_ = fVar102 * fVar128;
          auVar35._0_4_ = fVar95 * fVar121;
          fVar103 = local_16e0._8_4_;
          auVar35._8_4_ = fVar103 * fVar130;
          fVar104 = local_16e0._12_4_;
          auVar35._12_4_ = fVar104 * fVar132;
          fVar105 = local_16e0._16_4_;
          auVar35._16_4_ = fVar105 * fVar134;
          fVar106 = local_16e0._20_4_;
          auVar35._20_4_ = fVar106 * fVar136;
          fVar108 = local_16e0._24_4_;
          auVar35._24_4_ = fVar108 * fVar138;
          auVar35._28_4_ = auVar23._28_4_ + local_16c0._28_4_;
          auVar82 = local_1420;
          auVar36._4_4_ = fVar144 * fVar154;
          auVar36._0_4_ = fVar140 * fVar150;
          auVar36._8_4_ = fVar145 * fVar155;
          auVar36._12_4_ = fVar146 * fVar156;
          auVar36._16_4_ = fVar147 * fVar157;
          auVar36._20_4_ = fVar148 * fVar158;
          auVar36._24_4_ = fVar149 * fVar159;
          auVar36._28_4_ = auVar124._12_4_;
          auVar25 = vsubps_avx(auVar36,auVar35);
          auVar37._4_4_ = fVar185 * fVar154;
          auVar37._0_4_ = fVar181 * fVar150;
          auVar37._8_4_ = fVar187 * fVar155;
          auVar37._12_4_ = fVar189 * fVar156;
          auVar37._16_4_ = fVar191 * fVar157;
          auVar37._20_4_ = fVar193 * fVar158;
          auVar37._24_4_ = fVar195 * fVar159;
          auVar37._28_4_ = auVar21._28_4_ + local_1680._28_4_;
          auVar38._4_4_ = fVar102 * fVar115;
          auVar38._0_4_ = fVar95 * fVar110;
          auVar38._8_4_ = fVar103 * fVar116;
          auVar38._12_4_ = fVar104 * fVar117;
          auVar38._16_4_ = fVar105 * fVar118;
          auVar38._20_4_ = fVar106 * fVar119;
          auVar38._24_4_ = fVar108 * fVar120;
          auVar38._28_4_ = fVar89 + auVar22._28_4_;
          auVar26 = vsubps_avx(auVar38,auVar37);
          local_1800._4_4_ = (ray->dir).field_0.m128[1];
          local_1720._4_4_ = (ray->dir).field_0.m128[2];
          local_17c0._4_4_ = (ray->dir).field_0.m128[0];
          local_1740._0_4_ =
               local_17c0._4_4_ * auVar24._0_4_ +
               local_1800._4_4_ * auVar25._0_4_ + local_1720._4_4_ * auVar26._0_4_;
          local_1740._4_4_ =
               local_17c0._4_4_ * auVar24._4_4_ +
               local_1800._4_4_ * auVar25._4_4_ + local_1720._4_4_ * auVar26._4_4_;
          local_1740._8_4_ =
               local_17c0._4_4_ * auVar24._8_4_ +
               local_1800._4_4_ * auVar25._8_4_ + local_1720._4_4_ * auVar26._8_4_;
          local_1740._12_4_ =
               local_17c0._4_4_ * auVar24._12_4_ +
               local_1800._4_4_ * auVar25._12_4_ + local_1720._4_4_ * auVar26._12_4_;
          local_1740._16_4_ =
               local_17c0._4_4_ * auVar24._16_4_ +
               local_1800._4_4_ * auVar25._16_4_ + local_1720._4_4_ * auVar26._16_4_;
          local_1740._20_4_ =
               local_17c0._4_4_ * auVar24._20_4_ +
               local_1800._4_4_ * auVar25._20_4_ + local_1720._4_4_ * auVar26._20_4_;
          local_1740._24_4_ =
               local_17c0._4_4_ * auVar24._24_4_ +
               local_1800._4_4_ * auVar25._24_4_ + local_1720._4_4_ * auVar26._24_4_;
          local_1740._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar26._28_4_;
          auVar24 = vsubps_avx(local_16a0,auVar85);
          local_1440 = vsubps_avx(local_16c0,auVar20);
          fVar116 = fVar200 + auVar85._0_4_;
          fVar117 = fVar203 + auVar85._4_4_;
          fVar118 = fVar205 + auVar85._8_4_;
          fVar119 = fVar207 + auVar85._12_4_;
          fVar120 = fVar209 + auVar85._16_4_;
          fVar121 = fVar211 + auVar85._20_4_;
          fVar128 = fVar213 + auVar85._24_4_;
          fVar110 = auVar85._28_4_;
          fVar130 = fVar1 + auVar20._0_4_;
          fVar132 = fVar12 + auVar20._4_4_;
          fVar134 = fVar14 + auVar20._8_4_;
          fVar136 = fVar16 + auVar20._12_4_;
          fVar138 = fVar88 + auVar20._16_4_;
          fVar150 = fVar92 + auVar20._20_4_;
          fVar154 = fVar17 + auVar20._24_4_;
          fVar115 = auVar20._28_4_;
          fVar182 = local_1440._0_4_;
          fVar186 = local_1440._4_4_;
          auVar39._4_4_ = fVar186 * fVar117;
          auVar39._0_4_ = fVar182 * fVar116;
          fVar188 = local_1440._8_4_;
          auVar39._8_4_ = fVar188 * fVar118;
          fVar190 = local_1440._12_4_;
          auVar39._12_4_ = fVar190 * fVar119;
          fVar192 = local_1440._16_4_;
          auVar39._16_4_ = fVar192 * fVar120;
          fVar194 = local_1440._20_4_;
          auVar39._20_4_ = fVar194 * fVar121;
          fVar196 = local_1440._24_4_;
          auVar39._24_4_ = fVar196 * fVar128;
          auVar39._28_4_ = fVar89;
          fVar166 = auVar24._0_4_;
          fVar169 = auVar24._4_4_;
          auVar40._4_4_ = fVar169 * fVar132;
          auVar40._0_4_ = fVar166 * fVar130;
          fVar171 = auVar24._8_4_;
          auVar40._8_4_ = fVar171 * fVar134;
          fVar173 = auVar24._12_4_;
          auVar40._12_4_ = fVar173 * fVar136;
          fVar175 = auVar24._16_4_;
          auVar40._16_4_ = fVar175 * fVar138;
          fVar177 = auVar24._20_4_;
          auVar40._20_4_ = fVar177 * fVar150;
          fVar179 = auVar24._24_4_;
          auVar40._24_4_ = fVar179 * fVar154;
          auVar40._28_4_ = fVar115;
          auVar25 = vsubps_avx(auVar40,auVar39);
          auVar26 = vsubps_avx(local_1680,auVar81);
          fVar201 = auVar26._0_4_;
          fVar204 = auVar26._4_4_;
          auVar41._4_4_ = fVar204 * fVar132;
          auVar41._0_4_ = fVar201 * fVar130;
          fVar206 = auVar26._8_4_;
          auVar41._8_4_ = fVar206 * fVar134;
          fVar208 = auVar26._12_4_;
          auVar41._12_4_ = fVar208 * fVar136;
          fVar210 = auVar26._16_4_;
          auVar41._16_4_ = fVar210 * fVar138;
          fVar212 = auVar26._20_4_;
          auVar41._20_4_ = fVar212 * fVar150;
          fVar214 = auVar26._24_4_;
          auVar41._24_4_ = fVar214 * fVar154;
          auVar41._28_4_ = local_16c0._28_4_ + fVar115;
          fVar130 = fVar11 + auVar81._0_4_;
          fVar132 = fVar13 + auVar81._4_4_;
          fVar134 = fVar15 + auVar81._8_4_;
          fVar136 = fVar87 + auVar81._12_4_;
          fVar138 = fVar90 + auVar81._16_4_;
          fVar150 = fVar94 + auVar81._20_4_;
          fVar154 = fVar18 + auVar81._24_4_;
          auVar42._4_4_ = fVar186 * fVar132;
          auVar42._0_4_ = fVar182 * fVar130;
          auVar42._8_4_ = fVar188 * fVar134;
          auVar42._12_4_ = fVar190 * fVar136;
          auVar42._16_4_ = fVar192 * fVar138;
          auVar42._20_4_ = fVar194 * fVar150;
          auVar42._24_4_ = fVar196 * fVar154;
          auVar42._28_4_ = local_1440._28_4_;
          auVar26 = vsubps_avx(auVar42,auVar41);
          auVar43._4_4_ = fVar169 * fVar132;
          auVar43._0_4_ = fVar166 * fVar130;
          auVar43._8_4_ = fVar171 * fVar134;
          auVar43._12_4_ = fVar173 * fVar136;
          auVar43._16_4_ = fVar175 * fVar138;
          auVar43._20_4_ = fVar177 * fVar150;
          auVar43._24_4_ = fVar179 * fVar154;
          auVar43._28_4_ = local_1680._28_4_ + auVar81._28_4_;
          auVar44._4_4_ = fVar204 * fVar117;
          auVar44._0_4_ = fVar201 * fVar116;
          auVar44._8_4_ = fVar206 * fVar118;
          auVar44._12_4_ = fVar208 * fVar119;
          auVar44._16_4_ = fVar210 * fVar120;
          auVar44._20_4_ = fVar212 * fVar121;
          auVar44._24_4_ = fVar214 * fVar128;
          auVar44._28_4_ = fVar89 + fVar110;
          auVar27 = vsubps_avx(auVar44,auVar43);
          local_1460._0_4_ =
               local_17c0._4_4_ * auVar25._0_4_ +
               local_1800._4_4_ * auVar26._0_4_ + local_1720._4_4_ * auVar27._0_4_;
          local_1460._4_4_ =
               local_17c0._4_4_ * auVar25._4_4_ +
               local_1800._4_4_ * auVar26._4_4_ + local_1720._4_4_ * auVar27._4_4_;
          local_1460._8_4_ =
               local_17c0._4_4_ * auVar25._8_4_ +
               local_1800._4_4_ * auVar26._8_4_ + local_1720._4_4_ * auVar27._8_4_;
          local_1460._12_4_ =
               local_17c0._4_4_ * auVar25._12_4_ +
               local_1800._4_4_ * auVar26._12_4_ + local_1720._4_4_ * auVar27._12_4_;
          local_1460._16_4_ =
               local_17c0._4_4_ * auVar25._16_4_ +
               local_1800._4_4_ * auVar26._16_4_ + local_1720._4_4_ * auVar27._16_4_;
          local_1460._20_4_ =
               local_17c0._4_4_ * auVar25._20_4_ +
               local_1800._4_4_ * auVar26._20_4_ + local_1720._4_4_ * auVar27._20_4_;
          local_1460._24_4_ =
               local_17c0._4_4_ * auVar25._24_4_ +
               local_1800._4_4_ * auVar26._24_4_ + local_1720._4_4_ * auVar27._24_4_;
          local_1460._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
          auVar25 = vsubps_avx(auVar81,auVar21);
          fVar155 = auVar81._0_4_ + auVar21._0_4_;
          fVar156 = auVar81._4_4_ + auVar21._4_4_;
          fVar157 = auVar81._8_4_ + auVar21._8_4_;
          fVar158 = auVar81._12_4_ + auVar21._12_4_;
          fVar159 = auVar81._16_4_ + auVar21._16_4_;
          fVar89 = auVar81._20_4_ + auVar21._20_4_;
          fVar91 = auVar81._24_4_ + auVar21._24_4_;
          fVar93 = auVar81._28_4_ + auVar21._28_4_;
          local_14c0 = vsubps_avx(auVar85,auVar22);
          fVar130 = auVar85._0_4_ + auVar22._0_4_;
          fVar132 = auVar85._4_4_ + auVar22._4_4_;
          fVar134 = auVar85._8_4_ + auVar22._8_4_;
          fVar136 = auVar85._12_4_ + auVar22._12_4_;
          fVar138 = auVar85._16_4_ + auVar22._16_4_;
          fVar150 = auVar85._20_4_ + auVar22._20_4_;
          fVar154 = auVar85._24_4_ + auVar22._24_4_;
          auVar21 = vsubps_avx(auVar20,auVar23);
          fVar118 = auVar23._0_4_ + auVar20._0_4_;
          fVar119 = auVar23._4_4_ + auVar20._4_4_;
          fVar120 = auVar23._8_4_ + auVar20._8_4_;
          fVar121 = auVar23._12_4_ + auVar20._12_4_;
          fVar128 = auVar23._16_4_ + auVar20._16_4_;
          fVar107 = auVar23._20_4_ + auVar20._20_4_;
          fVar109 = auVar23._24_4_ + auVar20._24_4_;
          fVar122 = auVar21._0_4_;
          fVar129 = auVar21._4_4_;
          auVar45._4_4_ = fVar129 * fVar132;
          auVar45._0_4_ = fVar122 * fVar130;
          fVar131 = auVar21._8_4_;
          auVar45._8_4_ = fVar131 * fVar134;
          fVar133 = auVar21._12_4_;
          auVar45._12_4_ = fVar133 * fVar136;
          fVar135 = auVar21._16_4_;
          auVar45._16_4_ = fVar135 * fVar138;
          fVar137 = auVar21._20_4_;
          auVar45._20_4_ = fVar137 * fVar150;
          fVar139 = auVar21._24_4_;
          auVar45._24_4_ = fVar139 * fVar154;
          auVar45._28_4_ = auVar25._28_4_;
          fVar167 = local_14c0._0_4_;
          fVar170 = local_14c0._4_4_;
          auVar46._4_4_ = fVar170 * fVar119;
          auVar46._0_4_ = fVar167 * fVar118;
          fVar172 = local_14c0._8_4_;
          auVar46._8_4_ = fVar172 * fVar120;
          fVar174 = local_14c0._12_4_;
          auVar46._12_4_ = fVar174 * fVar121;
          fVar176 = local_14c0._16_4_;
          auVar46._16_4_ = fVar176 * fVar128;
          fVar178 = local_14c0._20_4_;
          auVar46._20_4_ = fVar178 * fVar107;
          fVar180 = local_14c0._24_4_;
          auVar46._24_4_ = fVar180 * fVar109;
          auVar46._28_4_ = fVar110;
          auVar81 = vsubps_avx(auVar46,auVar45);
          fVar116 = auVar25._0_4_;
          fVar117 = auVar25._4_4_;
          auVar47._4_4_ = fVar117 * fVar119;
          auVar47._0_4_ = fVar116 * fVar118;
          fVar118 = auVar25._8_4_;
          auVar47._8_4_ = fVar118 * fVar120;
          fVar119 = auVar25._12_4_;
          auVar47._12_4_ = fVar119 * fVar121;
          fVar120 = auVar25._16_4_;
          auVar47._16_4_ = fVar120 * fVar128;
          fVar121 = auVar25._20_4_;
          auVar47._20_4_ = fVar121 * fVar107;
          fVar128 = auVar25._24_4_;
          auVar47._24_4_ = fVar128 * fVar109;
          auVar47._28_4_ = auVar23._28_4_ + fVar115;
          auVar48._4_4_ = fVar129 * fVar156;
          auVar48._0_4_ = fVar122 * fVar155;
          auVar48._8_4_ = fVar131 * fVar157;
          auVar48._12_4_ = fVar133 * fVar158;
          auVar48._16_4_ = fVar135 * fVar159;
          auVar48._20_4_ = fVar137 * fVar89;
          auVar48._24_4_ = fVar139 * fVar91;
          auVar48._28_4_ = fVar110;
          auVar85 = vsubps_avx(auVar48,auVar47);
          auVar49._4_4_ = fVar170 * fVar156;
          auVar49._0_4_ = fVar167 * fVar155;
          auVar49._8_4_ = fVar172 * fVar157;
          auVar49._12_4_ = fVar174 * fVar158;
          auVar49._16_4_ = fVar176 * fVar159;
          auVar49._20_4_ = fVar178 * fVar89;
          auVar49._24_4_ = fVar180 * fVar91;
          auVar49._28_4_ = fVar93;
          auVar50._4_4_ = fVar117 * fVar132;
          auVar50._0_4_ = fVar116 * fVar130;
          auVar50._8_4_ = fVar118 * fVar134;
          auVar50._12_4_ = fVar119 * fVar136;
          auVar50._16_4_ = fVar120 * fVar138;
          auVar50._20_4_ = fVar121 * fVar150;
          auVar50._24_4_ = fVar128 * fVar154;
          auVar50._28_4_ = fVar110 + auVar22._28_4_;
          auVar20 = vsubps_avx(auVar50,auVar49);
          local_1720._0_4_ = local_1720._4_4_;
          fStack_1718 = local_1720._4_4_;
          fStack_1714 = local_1720._4_4_;
          fStack_1710 = local_1720._4_4_;
          fStack_170c = local_1720._4_4_;
          fStack_1708 = local_1720._4_4_;
          fStack_1704 = local_1720._4_4_;
          local_1800._0_4_ = local_1800._4_4_;
          fStack_17f8 = local_1800._4_4_;
          fStack_17f4 = local_1800._4_4_;
          fStack_17f0 = local_1800._4_4_;
          fStack_17ec = local_1800._4_4_;
          fStack_17e8 = local_1800._4_4_;
          fStack_17e4 = local_1800._4_4_;
          local_17c0._0_4_ = local_17c0._4_4_;
          fStack_17b8 = local_17c0._4_4_;
          fStack_17b4 = local_17c0._4_4_;
          fStack_17b0 = local_17c0._4_4_;
          fStack_17ac = local_17c0._4_4_;
          fStack_17a8 = local_17c0._4_4_;
          fStack_17a4 = local_17c0._4_4_;
          auVar84._0_4_ =
               local_17c0._4_4_ * auVar81._0_4_ +
               local_1800._4_4_ * auVar85._0_4_ + local_1720._4_4_ * auVar20._0_4_;
          auVar84._4_4_ =
               local_17c0._4_4_ * auVar81._4_4_ +
               local_1800._4_4_ * auVar85._4_4_ + local_1720._4_4_ * auVar20._4_4_;
          auVar84._8_4_ =
               local_17c0._4_4_ * auVar81._8_4_ +
               local_1800._4_4_ * auVar85._8_4_ + local_1720._4_4_ * auVar20._8_4_;
          auVar84._12_4_ =
               local_17c0._4_4_ * auVar81._12_4_ +
               local_1800._4_4_ * auVar85._12_4_ + local_1720._4_4_ * auVar20._12_4_;
          auVar84._16_4_ =
               local_17c0._4_4_ * auVar81._16_4_ +
               local_1800._4_4_ * auVar85._16_4_ + local_1720._4_4_ * auVar20._16_4_;
          auVar84._20_4_ =
               local_17c0._4_4_ * auVar81._20_4_ +
               local_1800._4_4_ * auVar85._20_4_ + local_1720._4_4_ * auVar20._20_4_;
          auVar84._24_4_ =
               local_17c0._4_4_ * auVar81._24_4_ +
               local_1800._4_4_ * auVar85._24_4_ + local_1720._4_4_ * auVar20._24_4_;
          auVar84._28_4_ = fVar93 + fVar93 + auVar20._28_4_;
          local_14a0._0_4_ = auVar84._0_4_ + local_1740._0_4_ + local_1460._0_4_;
          local_14a0._4_4_ = auVar84._4_4_ + local_1740._4_4_ + local_1460._4_4_;
          local_14a0._8_4_ = auVar84._8_4_ + local_1740._8_4_ + local_1460._8_4_;
          local_14a0._12_4_ = auVar84._12_4_ + local_1740._12_4_ + local_1460._12_4_;
          local_14a0._16_4_ = auVar84._16_4_ + local_1740._16_4_ + local_1460._16_4_;
          local_14a0._20_4_ = auVar84._20_4_ + local_1740._20_4_ + local_1460._20_4_;
          local_14a0._24_4_ = auVar84._24_4_ + local_1740._24_4_ + local_1460._24_4_;
          local_14a0._28_4_ = auVar84._28_4_ + local_1740._28_4_ + local_1460._28_4_;
          auVar81 = vminps_avx(local_1740,local_1460);
          auVar81 = vminps_avx(auVar81,auVar84);
          auVar98._8_4_ = 0x7fffffff;
          auVar98._0_8_ = 0x7fffffff7fffffff;
          auVar98._12_4_ = 0x7fffffff;
          auVar98._16_4_ = 0x7fffffff;
          auVar98._20_4_ = 0x7fffffff;
          auVar98._24_4_ = 0x7fffffff;
          auVar98._28_4_ = 0x7fffffff;
          local_1480 = vandps_avx(local_14a0,auVar98);
          fVar110 = local_1480._0_4_ * 1.1920929e-07;
          fVar115 = local_1480._4_4_ * 1.1920929e-07;
          auVar51._4_4_ = fVar115;
          auVar51._0_4_ = fVar110;
          fVar130 = local_1480._8_4_ * 1.1920929e-07;
          auVar51._8_4_ = fVar130;
          fVar132 = local_1480._12_4_ * 1.1920929e-07;
          auVar51._12_4_ = fVar132;
          fVar134 = local_1480._16_4_ * 1.1920929e-07;
          auVar51._16_4_ = fVar134;
          fVar136 = local_1480._20_4_ * 1.1920929e-07;
          auVar51._20_4_ = fVar136;
          fVar138 = local_1480._24_4_ * 1.1920929e-07;
          auVar51._24_4_ = fVar138;
          auVar51._28_4_ = 0x34000000;
          auVar152._0_8_ = CONCAT44(fVar115,fVar110) ^ 0x8000000080000000;
          auVar152._8_4_ = -fVar130;
          auVar152._12_4_ = -fVar132;
          auVar152._16_4_ = -fVar134;
          auVar152._20_4_ = -fVar136;
          auVar152._24_4_ = -fVar138;
          auVar152._28_4_ = 0xb4000000;
          auVar81 = vcmpps_avx(auVar81,auVar152,5);
          auVar20 = vmaxps_avx(local_1740,local_1460);
          auVar85 = vmaxps_avx(auVar20,auVar84);
          auVar85 = vcmpps_avx(auVar85,auVar51,2);
          auVar85 = vorps_avx(auVar81,auVar85);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = 0x3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar160._16_4_ = 0x3f800000;
          auVar160._20_4_ = 0x3f800000;
          auVar160._24_4_ = 0x3f800000;
          auVar160._28_4_ = 0x3f800000;
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar85 >> 0x7f,0) == '\0') &&
                (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar85 >> 0xbf,0) == '\0') &&
              (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar85[0x1f]) {
LAB_00e6c357:
            auVar153 = ZEXT3264(local_1520);
            auVar161 = ZEXT3264(local_1540);
            auVar163 = ZEXT3264(local_1560);
            auVar165 = ZEXT3264(local_1580);
            auVar168 = ZEXT3264(local_15a0);
            auVar184 = ZEXT3264(local_15c0);
            auVar198 = ZEXT3264(local_15e0);
            auVar114 = ZEXT3264(local_1600);
            auVar101 = ZEXT3264(local_1620);
            auVar127 = ZEXT3264(local_1640);
            auVar143 = ZEXT3264(local_1660);
          }
          else {
            auVar52._4_4_ = fVar169 * fVar144;
            auVar52._0_4_ = fVar166 * fVar140;
            auVar52._8_4_ = fVar171 * fVar145;
            auVar52._12_4_ = fVar173 * fVar146;
            auVar52._16_4_ = fVar175 * fVar147;
            auVar52._20_4_ = fVar177 * fVar148;
            auVar52._24_4_ = fVar179 * fVar149;
            auVar52._28_4_ = auVar81._28_4_;
            auVar53._4_4_ = fVar185 * fVar186;
            auVar53._0_4_ = fVar181 * fVar182;
            auVar53._8_4_ = fVar187 * fVar188;
            auVar53._12_4_ = fVar189 * fVar190;
            auVar53._16_4_ = fVar191 * fVar192;
            auVar53._20_4_ = fVar193 * fVar194;
            auVar53._24_4_ = fVar195 * fVar196;
            auVar53._28_4_ = 0x34000000;
            auVar22 = vsubps_avx(auVar53,auVar52);
            auVar54._4_4_ = fVar186 * fVar170;
            auVar54._0_4_ = fVar182 * fVar167;
            auVar54._8_4_ = fVar188 * fVar172;
            auVar54._12_4_ = fVar190 * fVar174;
            auVar54._16_4_ = fVar192 * fVar176;
            auVar54._20_4_ = fVar194 * fVar178;
            auVar54._24_4_ = fVar196 * fVar180;
            auVar54._28_4_ = auVar20._28_4_;
            auVar55._4_4_ = fVar169 * fVar129;
            auVar55._0_4_ = fVar166 * fVar122;
            auVar55._8_4_ = fVar171 * fVar131;
            auVar55._12_4_ = fVar173 * fVar133;
            auVar55._16_4_ = fVar175 * fVar135;
            auVar55._20_4_ = fVar177 * fVar137;
            auVar55._24_4_ = fVar179 * fVar139;
            auVar55._28_4_ = auVar24._28_4_;
            auVar23 = vsubps_avx(auVar55,auVar54);
            auVar113._8_4_ = 0x7fffffff;
            auVar113._0_8_ = 0x7fffffff7fffffff;
            auVar113._12_4_ = 0x7fffffff;
            auVar113._16_4_ = 0x7fffffff;
            auVar113._20_4_ = 0x7fffffff;
            auVar113._24_4_ = 0x7fffffff;
            auVar113._28_4_ = 0x7fffffff;
            auVar81 = vandps_avx(auVar52,auVar113);
            auVar20 = vandps_avx(auVar54,auVar113);
            auVar81 = vcmpps_avx(auVar81,auVar20,1);
            local_1360 = vblendvps_avx(auVar23,auVar22,auVar81);
            auVar56._4_4_ = fVar204 * fVar129;
            auVar56._0_4_ = fVar201 * fVar122;
            auVar56._8_4_ = fVar206 * fVar131;
            auVar56._12_4_ = fVar208 * fVar133;
            auVar56._16_4_ = fVar210 * fVar135;
            auVar56._20_4_ = fVar212 * fVar137;
            auVar56._24_4_ = fVar214 * fVar139;
            auVar56._28_4_ = auVar81._28_4_;
            auVar57._4_4_ = fVar204 * fVar144;
            auVar57._0_4_ = fVar201 * fVar140;
            auVar57._8_4_ = fVar206 * fVar145;
            auVar57._12_4_ = fVar208 * fVar146;
            auVar57._16_4_ = fVar210 * fVar147;
            auVar57._20_4_ = fVar212 * fVar148;
            auVar57._24_4_ = fVar214 * fVar149;
            auVar57._28_4_ = auVar22._28_4_;
            auVar58._4_4_ = fVar102 * fVar186;
            auVar58._0_4_ = fVar95 * fVar182;
            auVar58._8_4_ = fVar103 * fVar188;
            auVar58._12_4_ = fVar104 * fVar190;
            auVar58._16_4_ = fVar105 * fVar192;
            auVar58._20_4_ = fVar106 * fVar194;
            auVar58._24_4_ = fVar108 * fVar196;
            auVar58._28_4_ = local_1420._28_4_;
            auVar22 = vsubps_avx(auVar57,auVar58);
            auVar59._4_4_ = fVar186 * fVar117;
            auVar59._0_4_ = fVar182 * fVar116;
            auVar59._8_4_ = fVar188 * fVar118;
            auVar59._12_4_ = fVar190 * fVar119;
            auVar59._16_4_ = fVar192 * fVar120;
            auVar59._20_4_ = fVar194 * fVar121;
            auVar59._24_4_ = fVar196 * fVar128;
            auVar59._28_4_ = auVar20._28_4_;
            auVar23 = vsubps_avx(auVar59,auVar56);
            auVar81 = vandps_avx(auVar58,auVar113);
            auVar20 = vandps_avx(auVar56,auVar113);
            auVar81 = vcmpps_avx(auVar81,auVar20,1);
            local_1340 = vblendvps_avx(auVar23,auVar22,auVar81);
            auVar60._4_4_ = fVar169 * fVar117;
            auVar60._0_4_ = fVar166 * fVar116;
            auVar60._8_4_ = fVar171 * fVar118;
            auVar60._12_4_ = fVar173 * fVar119;
            auVar60._16_4_ = fVar175 * fVar120;
            auVar60._20_4_ = fVar177 * fVar121;
            auVar60._24_4_ = fVar179 * fVar128;
            auVar60._28_4_ = auVar81._28_4_;
            auVar61._4_4_ = fVar102 * fVar169;
            auVar61._0_4_ = fVar95 * fVar166;
            auVar61._8_4_ = fVar103 * fVar171;
            auVar61._12_4_ = fVar104 * fVar173;
            auVar61._16_4_ = fVar105 * fVar175;
            auVar61._20_4_ = fVar106 * fVar177;
            auVar61._24_4_ = fVar108 * fVar179;
            auVar61._28_4_ = auVar22._28_4_;
            auVar62._4_4_ = fVar185 * fVar204;
            auVar62._0_4_ = fVar181 * fVar201;
            auVar62._8_4_ = fVar187 * fVar206;
            auVar62._12_4_ = fVar189 * fVar208;
            auVar62._16_4_ = fVar191 * fVar210;
            auVar62._20_4_ = fVar193 * fVar212;
            auVar62._24_4_ = fVar195 * fVar214;
            auVar62._28_4_ = auVar21._28_4_;
            auVar63._4_4_ = fVar204 * fVar170;
            auVar63._0_4_ = fVar201 * fVar167;
            auVar63._8_4_ = fVar206 * fVar172;
            auVar63._12_4_ = fVar208 * fVar174;
            auVar63._16_4_ = fVar210 * fVar176;
            auVar63._20_4_ = fVar212 * fVar178;
            auVar63._24_4_ = fVar214 * fVar180;
            auVar63._28_4_ = auVar25._28_4_;
            auVar21 = vsubps_avx(auVar61,auVar62);
            auVar22 = vsubps_avx(auVar63,auVar60);
            auVar81 = vandps_avx(auVar62,auVar113);
            auVar20 = vandps_avx(auVar60,auVar113);
            auVar20 = vcmpps_avx(auVar81,auVar20,1);
            local_1320 = vblendvps_avx(auVar22,auVar21,auVar20);
            auVar80 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            fVar115 = local_1320._0_4_;
            fVar116 = local_1320._4_4_;
            fVar117 = local_1320._8_4_;
            fVar118 = local_1320._12_4_;
            fVar119 = local_1320._16_4_;
            fVar120 = local_1320._20_4_;
            fVar121 = local_1320._24_4_;
            fVar154 = local_1340._0_4_;
            fVar155 = local_1340._4_4_;
            fVar156 = local_1340._8_4_;
            fVar157 = local_1340._12_4_;
            fVar158 = local_1340._16_4_;
            fVar159 = local_1340._20_4_;
            fVar89 = local_1340._24_4_;
            fVar91 = local_1360._0_4_;
            fVar93 = local_1360._4_4_;
            fVar95 = local_1360._8_4_;
            fVar102 = local_1360._12_4_;
            fVar103 = local_1360._16_4_;
            fVar104 = local_1360._20_4_;
            fVar105 = local_1360._24_4_;
            fVar110 = fVar91 * local_17c0._4_4_ +
                      fVar154 * local_1800._4_4_ + fVar115 * local_1720._4_4_;
            fVar128 = fVar93 * local_17c0._4_4_ +
                      fVar155 * local_1800._4_4_ + fVar116 * local_1720._4_4_;
            fVar130 = fVar95 * local_17c0._4_4_ +
                      fVar156 * local_1800._4_4_ + fVar117 * local_1720._4_4_;
            fVar132 = fVar102 * local_17c0._4_4_ +
                      fVar157 * local_1800._4_4_ + fVar118 * local_1720._4_4_;
            fVar134 = fVar103 * local_17c0._4_4_ +
                      fVar158 * local_1800._4_4_ + fVar119 * local_1720._4_4_;
            fVar136 = fVar104 * local_17c0._4_4_ +
                      fVar159 * local_1800._4_4_ + fVar120 * local_1720._4_4_;
            fVar138 = fVar105 * local_17c0._4_4_ +
                      fVar89 * local_1800._4_4_ + fVar121 * local_1720._4_4_;
            fVar150 = auVar21._28_4_ + auVar21._28_4_ + 0.0;
            auVar99._0_4_ = fVar110 + fVar110;
            auVar99._4_4_ = fVar128 + fVar128;
            auVar99._8_4_ = fVar130 + fVar130;
            auVar99._12_4_ = fVar132 + fVar132;
            auVar99._16_4_ = fVar134 + fVar134;
            auVar99._20_4_ = fVar136 + fVar136;
            auVar99._24_4_ = fVar138 + fVar138;
            auVar99._28_4_ = fVar150 + fVar150;
            fVar110 = auVar81._28_4_;
            auVar81 = vrcpps_avx(auVar99);
            fVar128 = fVar91 * fVar11 + fVar154 * fVar200 + fVar115 * fVar1;
            fVar130 = fVar93 * fVar13 + fVar155 * fVar203 + fVar116 * fVar12;
            fVar132 = fVar95 * fVar15 + fVar156 * fVar205 + fVar117 * fVar14;
            fVar87 = fVar102 * fVar87 + fVar157 * fVar207 + fVar118 * fVar16;
            fVar88 = fVar103 * fVar90 + fVar158 * fVar209 + fVar119 * fVar88;
            fVar90 = fVar104 * fVar94 + fVar159 * fVar211 + fVar120 * fVar92;
            fVar92 = fVar105 * fVar18 + fVar89 * fVar213 + fVar121 * fVar17;
            fVar94 = fVar110 + fVar110 + fVar150;
            fVar1 = auVar81._0_4_;
            fVar11 = auVar81._4_4_;
            auVar64._4_4_ = auVar99._4_4_ * fVar11;
            auVar64._0_4_ = auVar99._0_4_ * fVar1;
            fVar12 = auVar81._8_4_;
            auVar64._8_4_ = auVar99._8_4_ * fVar12;
            fVar13 = auVar81._12_4_;
            auVar64._12_4_ = auVar99._12_4_ * fVar13;
            fVar14 = auVar81._16_4_;
            auVar64._16_4_ = auVar99._16_4_ * fVar14;
            fVar15 = auVar81._20_4_;
            auVar64._20_4_ = auVar99._20_4_ * fVar15;
            fVar16 = auVar81._24_4_;
            auVar64._24_4_ = auVar99._24_4_ * fVar16;
            auVar64._28_4_ = fVar110;
            auVar81 = vsubps_avx(auVar160,auVar64);
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar141._4_4_ = uVar2;
            auVar141._0_4_ = uVar2;
            auVar141._8_4_ = uVar2;
            auVar141._12_4_ = uVar2;
            auVar141._16_4_ = uVar2;
            auVar141._20_4_ = uVar2;
            auVar141._24_4_ = uVar2;
            auVar141._28_4_ = uVar2;
            local_12a0._4_4_ = (fVar130 + fVar130) * (fVar11 + fVar11 * auVar81._4_4_);
            local_12a0._0_4_ = (fVar128 + fVar128) * (fVar1 + fVar1 * auVar81._0_4_);
            local_12a0._8_4_ = (fVar132 + fVar132) * (fVar12 + fVar12 * auVar81._8_4_);
            local_12a0._12_4_ = (fVar87 + fVar87) * (fVar13 + fVar13 * auVar81._12_4_);
            local_12a0._16_4_ = (fVar88 + fVar88) * (fVar14 + fVar14 * auVar81._16_4_);
            local_12a0._20_4_ = (fVar90 + fVar90) * (fVar15 + fVar15 * auVar81._20_4_);
            local_12a0._24_4_ = (fVar92 + fVar92) * (fVar16 + fVar16 * auVar81._24_4_);
            local_12a0._28_4_ = fVar94 + fVar94;
            auVar81 = vcmpps_avx(auVar141,local_12a0,2);
            fVar1 = ray->tfar;
            auVar142._4_4_ = fVar1;
            auVar142._0_4_ = fVar1;
            auVar142._8_4_ = fVar1;
            auVar142._12_4_ = fVar1;
            auVar142._16_4_ = fVar1;
            auVar142._20_4_ = fVar1;
            auVar142._24_4_ = fVar1;
            auVar142._28_4_ = fVar1;
            auVar85 = vcmpps_avx(local_12a0,auVar142,2);
            auVar81 = vandps_avx(auVar85,auVar81);
            auVar85 = vcmpps_avx(auVar99,_DAT_01f7b000,4);
            auVar81 = vandps_avx(auVar81,auVar85);
            auVar123 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
            auVar80 = vpand_avx(auVar123,auVar80);
            auVar123 = vpmovsxwd_avx(auVar80);
            auVar19 = vpshufd_avx(auVar80,0xee);
            auVar19 = vpmovsxwd_avx(auVar19);
            local_1300._16_16_ = auVar19;
            local_1300._0_16_ = auVar123;
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar19 >> 0x3f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar19[0xf]) goto LAB_00e6c357;
            local_1800 = ray;
            local_1720 = puVar76;
            local_13c0 = local_1740._0_4_;
            fStack_13bc = local_1740._4_4_;
            fStack_13b8 = local_1740._8_4_;
            fStack_13b4 = local_1740._12_4_;
            fStack_13b0 = local_1740._16_4_;
            fStack_13ac = local_1740._20_4_;
            fStack_13a8 = local_1740._24_4_;
            fStack_13a4 = local_1740._28_4_;
            local_13a0 = local_1460._0_4_;
            fStack_139c = local_1460._4_4_;
            fStack_1398 = local_1460._8_4_;
            fStack_1394 = local_1460._12_4_;
            fStack_1390 = local_1460._16_4_;
            fStack_138c = local_1460._20_4_;
            fStack_1388 = local_1460._24_4_;
            fStack_1384 = local_1460._28_4_;
            local_1380 = local_14a0;
            local_1220 = local_14e0;
            auVar81 = vrcpps_avx(local_14a0);
            fVar1 = auVar81._0_4_;
            fVar11 = auVar81._4_4_;
            auVar65._4_4_ = local_14a0._4_4_ * fVar11;
            auVar65._0_4_ = local_14a0._0_4_ * fVar1;
            fVar12 = auVar81._8_4_;
            auVar65._8_4_ = local_14a0._8_4_ * fVar12;
            fVar13 = auVar81._12_4_;
            auVar65._12_4_ = local_14a0._12_4_ * fVar13;
            fVar14 = auVar81._16_4_;
            auVar65._16_4_ = local_14a0._16_4_ * fVar14;
            fVar15 = auVar81._20_4_;
            auVar65._20_4_ = local_14a0._20_4_ * fVar15;
            fVar16 = auVar81._24_4_;
            auVar65._24_4_ = local_14a0._24_4_ * fVar16;
            auVar65._28_4_ = auVar19._12_4_;
            auVar85 = vsubps_avx(auVar160,auVar65);
            auVar86._0_4_ = fVar1 + fVar1 * auVar85._0_4_;
            auVar86._4_4_ = fVar11 + fVar11 * auVar85._4_4_;
            auVar86._8_4_ = fVar12 + fVar12 * auVar85._8_4_;
            auVar86._12_4_ = fVar13 + fVar13 * auVar85._12_4_;
            auVar86._16_4_ = fVar14 + fVar14 * auVar85._16_4_;
            auVar86._20_4_ = fVar15 + fVar15 * auVar85._20_4_;
            auVar86._24_4_ = fVar16 + fVar16 * auVar85._24_4_;
            auVar86._28_4_ = auVar81._28_4_ + auVar85._28_4_;
            auVar100._8_4_ = 0x219392ef;
            auVar100._0_8_ = 0x219392ef219392ef;
            auVar100._12_4_ = 0x219392ef;
            auVar100._16_4_ = 0x219392ef;
            auVar100._20_4_ = 0x219392ef;
            auVar100._24_4_ = 0x219392ef;
            auVar100._28_4_ = 0x219392ef;
            auVar85 = vcmpps_avx(local_1480,auVar100,5);
            auVar81 = vandps_avx(auVar85,auVar86);
            auVar66._4_4_ = local_1740._4_4_ * auVar81._4_4_;
            auVar66._0_4_ = local_1740._0_4_ * auVar81._0_4_;
            auVar66._8_4_ = local_1740._8_4_ * auVar81._8_4_;
            auVar66._12_4_ = local_1740._12_4_ * auVar81._12_4_;
            auVar66._16_4_ = local_1740._16_4_ * auVar81._16_4_;
            auVar66._20_4_ = local_1740._20_4_ * auVar81._20_4_;
            auVar66._24_4_ = local_1740._24_4_ * auVar81._24_4_;
            auVar66._28_4_ = auVar85._28_4_;
            auVar85 = vminps_avx(auVar66,auVar160);
            auVar67._4_4_ = local_1460._4_4_ * auVar81._4_4_;
            auVar67._0_4_ = local_1460._0_4_ * auVar81._0_4_;
            auVar67._8_4_ = local_1460._8_4_ * auVar81._8_4_;
            auVar67._12_4_ = local_1460._12_4_ * auVar81._12_4_;
            auVar67._16_4_ = local_1460._16_4_ * auVar81._16_4_;
            auVar67._20_4_ = local_1460._20_4_ * auVar81._20_4_;
            auVar67._24_4_ = local_1460._24_4_ * auVar81._24_4_;
            auVar67._28_4_ = auVar81._28_4_;
            auVar81 = vminps_avx(auVar67,auVar160);
            auVar20 = vsubps_avx(auVar160,auVar85);
            auVar21 = vsubps_avx(auVar160,auVar81);
            local_12c0 = vblendvps_avx(auVar81,auVar20,local_14e0);
            local_12e0 = vblendvps_avx(auVar85,auVar21,local_14e0);
            local_1280._4_4_ = fVar93 * (float)local_1500._4_4_;
            local_1280._0_4_ = fVar91 * (float)local_1500._0_4_;
            local_1280._8_4_ = fVar95 * fStack_14f8;
            local_1280._12_4_ = fVar102 * fStack_14f4;
            local_1280._16_4_ = fVar103 * fStack_14f0;
            local_1280._20_4_ = fVar104 * fStack_14ec;
            local_1280._24_4_ = fVar105 * fStack_14e8;
            local_1280._28_4_ = local_12c0._28_4_;
            local_1260[0] = fVar154 * (float)local_1500._0_4_;
            local_1260[1] = fVar155 * (float)local_1500._4_4_;
            local_1260[2] = fVar156 * fStack_14f8;
            local_1260[3] = fVar157 * fStack_14f4;
            fStack_1250 = fVar158 * fStack_14f0;
            fStack_124c = fVar159 * fStack_14ec;
            fStack_1248 = fVar89 * fStack_14e8;
            uStack_1244 = local_12e0._28_4_;
            local_1240[0] = (float)local_1500._0_4_ * fVar115;
            local_1240[1] = (float)local_1500._4_4_ * fVar116;
            local_1240[2] = fStack_14f8 * fVar117;
            local_1240[3] = fStack_14f4 * fVar118;
            fStack_1230 = fStack_14f0 * fVar119;
            fStack_122c = fStack_14ec * fVar120;
            fStack_1228 = fStack_14e8 * fVar121;
            uStack_1224 = local_1320._28_4_;
            auVar80 = vpsllw_avx(auVar80,0xf);
            auVar80 = vpacksswb_avx(auVar80,auVar80);
            uVar69 = (ulong)(byte)(SUB161(auVar80 >> 7,0) & 1 | (SUB161(auVar80 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar80 >> 0x3f,0) << 7);
            auVar153 = ZEXT3264(local_1520);
            auVar161 = ZEXT3264(local_1540);
            auVar163 = ZEXT3264(local_1560);
            auVar165 = ZEXT3264(local_1580);
            auVar168 = ZEXT3264(local_15a0);
            auVar184 = ZEXT3264(local_15c0);
            auVar198 = ZEXT3264(local_15e0);
            auVar114 = ZEXT3264(local_1600);
            auVar101 = ZEXT3264(local_1620);
            auVar127 = ZEXT3264(local_1640);
            auVar143 = ZEXT3264(local_1660);
            local_1420 = auVar82;
            do {
              uVar71 = 0;
              if (uVar69 != 0) {
                for (; (uVar69 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                }
              }
              local_1788 = *(uint *)((long)&local_13e0 + uVar71 * 4);
              pGVar9 = (pSVar75->geometries).items[local_1788].ptr;
              if ((pGVar9->mask & *(uint *)((long)local_1800 + 0x24)) == 0) {
                uVar69 = uVar69 ^ 1L << (uVar71 & 0x3f);
              }
              else {
                local_17c0 = uVar71;
                pRVar74 = context->args;
                if ((pRVar74->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e6c3de;
                local_16a0._0_8_ = uVar69;
                local_1680._0_8_ = uVar77;
                local_1740._0_8_ = context;
                local_1770.context = context->user;
                local_17a0 = *(undefined4 *)(local_1280 + uVar71 * 4);
                local_179c = local_1260[uVar71];
                local_1798 = local_1240[uVar71];
                local_1794 = *(undefined4 *)(local_12e0 + uVar71 * 4);
                local_1790 = *(undefined4 *)(local_12c0 + uVar71 * 4);
                local_178c = *(undefined4 *)((long)&local_1400 + uVar71 * 4);
                local_1784 = (local_1770.context)->instID[0];
                local_1780 = (local_1770.context)->instPrimID[0];
                local_16c0._0_4_ = *(undefined4 *)((long)local_1800 + 0x20);
                *(undefined4 *)((long)local_1800 + 0x20) = *(undefined4 *)(local_12a0 + uVar71 * 4);
                local_180c = -1;
                local_1770.valid = &local_180c;
                local_1770.geometryUserPtr = pGVar9->userPtr;
                local_1770.ray = (RTCRayN *)local_1800;
                local_1770.hit = (RTCHitN *)&local_17a0;
                local_1770.N = 1;
                local_16e0._0_8_ = pGVar9;
                if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e6c252:
                  if ((pRVar74->filter == (RTCFilterFunctionN)0x0) ||
                     (((pRVar74->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_16e0._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e6c3de:
                    *(undefined4 *)((long)local_1800 + 0x20) = 0xff800000;
                    return;
                  }
                  (*pRVar74->filter)(&local_1770);
                  if (*local_1770.valid != 0) goto LAB_00e6c3de;
                }
                else {
                  local_1700._0_8_ = pRVar74;
                  (*pGVar9->occlusionFilterN)(&local_1770);
                  pRVar74 = (RTCIntersectArguments *)local_1700._0_8_;
                  if (*local_1770.valid != 0) goto LAB_00e6c252;
                }
                *(undefined4 *)((long)local_1800 + 0x20) = local_16c0._0_4_;
                uVar69 = local_16a0._0_8_ ^ 1L << (local_17c0 & 0x3f);
                auVar153 = ZEXT3264(local_1520);
                auVar161 = ZEXT3264(local_1540);
                auVar163 = ZEXT3264(local_1560);
                auVar165 = ZEXT3264(local_1580);
                auVar168 = ZEXT3264(local_15a0);
                auVar184 = ZEXT3264(local_15c0);
                auVar198 = ZEXT3264(local_15e0);
                auVar114 = ZEXT3264(local_1600);
                auVar101 = ZEXT3264(local_1620);
                auVar127 = ZEXT3264(local_1640);
                auVar143 = ZEXT3264(local_1660);
                context = (RayQueryContext *)local_1740._0_8_;
                pSVar75 = local_1808;
                uVar77 = local_1680._0_8_;
              }
            } while (uVar69 != 0);
            ray = local_1800;
            puVar76 = local_1720;
          }
        }
        goto LAB_00e6b85d;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }